

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

int mpt_bind(mpt_socket *sd,char *where,mpt_fdmode *mode,int backlog)

{
  ushort uVar1;
  mpt_fdmode mVar2;
  int iVar3;
  int *piVar4;
  int local_3c;
  int local_38;
  int res;
  int sock;
  mpt_fdmode info;
  int backlog_local;
  mpt_fdmode *mode_local;
  char *where_local;
  mpt_socket *sd_local;
  
  info._0_4_ = backlog;
  unique0x100001f5 = mode;
  if (where == (char *)0x0) {
    iVar3 = sd->_id;
    if (iVar3 < 0) {
      return 0;
    }
    socketUnbind(iVar3);
    close(iVar3);
    sd->_id = -1;
    return 1;
  }
  if (mode == (mpt_fdmode *)0x0) {
    local_38 = mpt_mode_parse(&res,where);
    mVar2 = _res;
    if (local_38 < 0) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      return -1;
    }
    if (local_38 == 0) {
      uVar1 = (ushort)res;
      res._0_3_ = CONCAT12(1,uVar1 & 0xff00);
      sock._2_2_ = mVar2.stream;
      stack0xffffffffffffffcf = 0;
    }
  }
  else {
    _res = *mode;
    local_38 = 0;
  }
  if ((char)res < '\0') {
    local_3c = -1;
    if (((ulong)_res & 0x10000) != 0) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      return -1;
    }
    if (((ulong)_res & 0x400000) != 0) {
      local_3c = mkfifo(where,(uint)(ushort)sock);
      if (local_3c < 0) {
        if (((ulong)_res & 0x800000) != 0) {
          return local_3c;
        }
      }
      else {
        _res = (mpt_fdmode)((ulong)_res & 0xffffffffff3fffff);
      }
    }
    local_38 = open(where + local_38,(uint)res._2_2_,(ulong)_res >> 0x20 & 0xffff);
    if (local_38 < 0) {
      if (local_3c < 0) {
        return local_38;
      }
      unlink(where);
      return local_38;
    }
    _res = (mpt_fdmode)((ulong)_res & 0xffffffff);
  }
  else {
    local_38 = socketSet(where + local_38,(mpt_fdmode *)&res,bind);
    if (local_38 < 0) {
      return local_38;
    }
    if (((sock._2_2_ == 7) && (-1 < (int)info._0_4_)) &&
       (iVar3 = listen(local_38,info._0_4_), iVar3 < 0)) {
      close(local_38);
      return -1;
    }
  }
  if (-1 < sd->_id) {
    close(sd->_id);
  }
  sd->_id = local_38;
  return (uint)(ushort)sock;
}

Assistant:

extern int mpt_bind(MPT_STRUCT(socket) *sd, const char *where, const MPT_STRUCT(fdmode) *mode, int backlog)
{
	MPT_STRUCT(fdmode) info;
	int sock;
	
	if (!where) {
		if ((sock = sd->_id) < 0) {
			return 0;
		}
		(void) socketUnbind(sock);
		(void) close(sock);
		sd->_id = -1;
		return 1;
	}
	/* use mode passed by caller */
	if (mode) {
		info = *mode;
		sock = 0;
	}
	/* detect mode based on prefix */
	else if ((sock = mpt_mode_parse(&info, where)) < 0) {
		errno = EINVAL;
		return -1;
	}
	/* no prefix detected: default to IP socket */
	else if (!sock) {
		info.family = AF_UNSPEC;
		info.param.sock.type = SOCK_STREAM;
		info.param.sock.proto = 0;
		info.param.sock.port = 0;
	}
	/* open as normal file */
	if (info.family < 0) {
		int res = -1;
		if (info.param.file.open & O_WRONLY) {
			errno = EINVAL;
			return -1;
		}
		if (info.param.file.open & O_CREAT) {
			if ((res = mkfifo(where, info.param.file.perm)) >= 0) {
				info.param.file.open &= ~(O_EXCL | O_CREAT);
			}
			else if (info.param.file.open & O_EXCL) {
				return res;
			}
		}
		if ((sock = open(where + sock, info.param.file.open, info.param.file.perm)) < 0) {
			if (res >= 0) {
				unlink(where);
			}
			return sock;
		}
		info.stream = 0;
		info.param.sock.port = 0;
	}
	/* bind socket to address */
	else if ((sock = socketSet(where + sock, &info, bind)) < 0) {
		return sock;
	}
	/* require listening state */
	else if ((info.stream == (MPT_SOCKETFLAG(Read) | MPT_SOCKETFLAG(Write) | MPT_SOCKETFLAG(Stream)))
	    && (backlog >= 0)
	    && listen(sock, backlog) < 0) {
		(void) close(sock);
		return -1;
	}
	if (sd->_id >= 0) {
		(void) close(sd->_id);
	}
	sd->_id = sock;
	
	return info.param.sock.port;
}